

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O1

int AF_DFloor_CreateFloor
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  VMValue *pVVar2;
  VMValue *pVVar3;
  bool bVar4;
  int iVar5;
  VMValue *pVVar6;
  VMValue *pVVar7;
  VMValue *pVVar8;
  VMValue *pVVar9;
  sector_t_conflict *sec;
  char *pcVar10;
  
  if (numparam < 1) {
    pcVar10 = "(paramnum) < numparam";
  }
  else {
    if ((param->field_0).field_3.Type == '\x03') {
      sec = (sector_t_conflict *)(param->field_0).field_1.a;
      if (sec == (sector_t_conflict *)0x0) {
        NullParam("\"sec\"");
        sec = (sector_t_conflict *)(param->field_0).field_1.a;
      }
      if (numparam == 1) {
        pcVar10 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          if (numparam < 3) {
            pcVar10 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\x03') {
              if (numparam == 3) {
                pcVar10 = "(paramnum) < numparam";
              }
              else {
                if (param[3].field_0.field_3.Type == '\x01') {
                  pVVar1 = param + 1;
                  pVVar2 = param + 2;
                  pVVar3 = param + 3;
                  if (numparam < 5) {
                    pVVar6 = defaultparam->Array;
                    if (pVVar6[4].field_0.field_3.Type != '\x01') {
                      pcVar10 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                      goto LAB_003f863d;
                    }
                  }
                  else {
                    pVVar6 = param;
                    if (param[4].field_0.field_3.Type != '\x01') {
                      pcVar10 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003f863d:
                      __assert_fail(pcVar10,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                                    ,0x1f6,
                                    "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                  }
                  if (numparam < 6) {
                    pVVar7 = defaultparam->Array;
                    if (pVVar7[5].field_0.field_3.Type != '\0') {
                      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
                      goto LAB_003f865c;
                    }
                  }
                  else {
                    pVVar7 = param;
                    if (param[5].field_0.field_3.Type != '\0') {
                      pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003f865c:
                      __assert_fail(pcVar10,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                                    ,0x1f7,
                                    "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                  }
                  if (numparam < 7) {
                    pVVar8 = defaultparam->Array;
                    if (pVVar8[6].field_0.field_3.Type != '\0') {
                      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
                      goto LAB_003f867b;
                    }
                  }
                  else {
                    pVVar8 = param;
                    if (param[6].field_0.field_3.Type != '\0') {
                      pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003f867b:
                      __assert_fail(pcVar10,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                                    ,0x1f8,
                                    "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                  }
                  if (numparam < 8) {
                    pVVar9 = defaultparam->Array;
                    if (pVVar9[7].field_0.field_3.Type != '\0') {
                      pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
                      goto LAB_003f869a;
                    }
                  }
                  else {
                    pVVar9 = param;
                    if (param[7].field_0.field_3.Type != '\0') {
                      pcVar10 = "(param[paramnum]).Type == REGT_INT";
LAB_003f869a:
                      __assert_fail(pcVar10,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                                    ,0x1f9,
                                    "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                  }
                  if (numparam < 9) {
                    param = defaultparam->Array;
                    if (param[8].field_0.field_3.Type == '\0') goto LAB_003f8502;
                    pcVar10 = "(defaultparam[paramnum]).Type == REGT_INT";
                  }
                  else {
                    if (param[8].field_0.field_3.Type == '\0') {
LAB_003f8502:
                      bVar4 = P_CreateFloor(sec,(pVVar1->field_0).i,
                                            (line_t_conflict *)(pVVar2->field_0).field_1.a,
                                            (pVVar3->field_0).f,pVVar6[4].field_0.f,
                                            pVVar7[5].field_0.i,pVVar8[6].field_0.i,
                                            param[8].field_0.i != 0,pVVar9[7].field_0.i != 0);
                      if (numret < 1) {
                        iVar5 = 0;
                      }
                      else {
                        if (ret == (VMReturn *)0x0) {
                          __assert_fail("ret != NULL",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                                        ,0x1fb,
                                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                        if (ret->RegType != '\0') {
                          __assert_fail("RegType == REGT_INT",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                        ,0x13f,"void VMReturn::SetInt(int)");
                        }
                        *(uint *)ret->Location = (uint)bVar4;
                        iVar5 = 1;
                      }
                      return iVar5;
                    }
                    pcVar10 = "(param[paramnum]).Type == REGT_INT";
                  }
                  __assert_fail(pcVar10,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                                ,0x1fa,
                                "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar10 = "param[paramnum].Type == REGT_FLOAT";
              }
              __assert_fail(pcVar10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                            ,0x1f5,
                            "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar10 = "param[paramnum].Type == REGT_POINTER";
          }
          __assert_fail(pcVar10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                        ,500,
                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar10 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                    ,499,
                    "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    pcVar10 = "param[paramnum].Type == REGT_POINTER";
  }
  __assert_fail(pcVar10,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                ,0x1f2,
                "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(DFloor, CreateFloor)
{
	PARAM_PROLOGUE;
	PARAM_POINTER_NOT_NULL(sec, sector_t);
	PARAM_INT(floortype);
	PARAM_POINTER(ln, line_t);
	PARAM_FLOAT(speed);
	PARAM_FLOAT_DEF(height);
	PARAM_INT_DEF(crush);
	PARAM_INT_DEF(change);
	PARAM_BOOL_DEF(hereticlower);
	PARAM_BOOL_DEF(hexencrush);
	ACTION_RETURN_BOOL(P_CreateFloor(sec, (DFloor::EFloor)floortype, ln, speed, height, crush, change, hexencrush, hereticlower));
}